

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

IStream * Json::operator>>(IStream *sin,Value *root)

{
  CharReaderBuilder *this;
  bool bVar1;
  undefined1 local_68 [7];
  bool ok;
  String errs;
  CharReaderBuilder b;
  Value *root_local;
  IStream *sin_local;
  
  this = (CharReaderBuilder *)((long)&errs.field_2 + 8);
  CharReaderBuilder::CharReaderBuilder(this);
  std::__cxx11::string::string((string *)local_68);
  bVar1 = parseFromStream((Factory *)this,sin,root,(String *)local_68);
  if (!bVar1) {
    throwRuntimeError((String *)local_68);
  }
  std::__cxx11::string::~string((string *)local_68);
  CharReaderBuilder::~CharReaderBuilder((CharReaderBuilder *)((long)&errs.field_2 + 8));
  return sin;
}

Assistant:

IStream& operator>>(IStream& sin, Value& root) {
  CharReaderBuilder b;
  String errs;
  bool ok = parseFromStream(b, sin, &root, &errs);
  if (!ok) {
    throwRuntimeError(errs);
  }
  return sin;
}